

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal_matcher.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::
literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<false>>
::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (literal_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_mpl_::bool_<false>_>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,
          matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *next)

{
  bool bVar1;
  char cVar2;
  reference pcVar3;
  regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *prVar4;
  ulong uVar5;
  long *in_RDX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  bool bVar6;
  bool local_1;
  
  bVar1 = match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::eos(in_RDI);
  bVar6 = true;
  if (!bVar1) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(in_RSI);
    cVar2 = *pcVar3;
    prVar4 = traits_cast<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                       ((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x16472e);
    cVar2 = translate<char,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                      ((int)cVar2,prVar4);
    bVar6 = cVar2 != *(char *)&(in_RDI->cur_)._M_current;
  }
  if (bVar6) {
    local_1 = false;
  }
  else {
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(in_RSI);
    uVar5 = (**(code **)(*in_RDX + 0x10))(in_RDX,in_RSI);
    if ((uVar5 & 1) == 0) {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator--(in_RSI);
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            if(state.eos() || Not::value ==
                (detail::translate(*state.cur_, traits_cast<Traits>(state), icase_type()) == this->ch_))
            {
                return false;
            }

            ++state.cur_;
            if(next.match(state))
            {
                return true;
            }

            --state.cur_;
            return false;
        }